

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_template.cpp
# Opt level: O1

unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> __thiscall
pfederc::Parser::fromExprToTemplateDecl
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *rhs)

{
  long *plVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  long lVar6;
  _func_int **pp_Var7;
  Lexer *pLVar8;
  long *in_RDX;
  Parser *this_00;
  Error<pfederc::SyntaxErrorCode> *local_38;
  undefined1 local_30 [16];
  
  lVar6 = *in_RDX;
  if (lVar6 != 0) {
    if (*(int *)(lVar6 + 0x18) == 0) {
      lVar6 = __dynamic_cast(lVar6,&Expr::typeinfo,&TokenExpr::typeinfo,0);
      if (lVar6 == 0) goto LAB_00119bfe;
      bVar5 = Token::operator==(*(Token **)(lVar6 + 0x38),TOK_ID);
      if (bVar5) {
        lVar6 = *in_RDX;
        *in_RDX = 0;
        if (lVar6 == 0) {
          pp_Var7 = (_func_int **)0x0;
        }
        else {
          pp_Var7 = (_func_int **)__dynamic_cast(lVar6,&Expr::typeinfo,&TokenExpr::typeinfo,0);
        }
        pLVar8 = (Lexer *)operator_new(0x10);
        pLVar8->_vptr_Lexer = pp_Var7;
        *(undefined8 *)&pLVar8->cfg = 0;
        goto LAB_00119bb0;
      }
    }
    plVar1 = (long *)*in_RDX;
    if ((int)plVar1[3] == 0x12) {
      if ((undefined **)*plVar1 != &PTR__BiOpExpr_0012b998) {
        __cxa_bad_cast();
      }
      if ((short)plVar1[8] != 0x53) goto LAB_00119afd;
      if ((undefined **)*plVar1 != &PTR__BiOpExpr_0012b998) {
LAB_00119bfe:
        __cxa_bad_cast();
      }
      if (*(int *)(plVar1[9] + 0x18) == 0) {
        lVar6 = __dynamic_cast(plVar1[9],&Expr::typeinfo,&TokenExpr::typeinfo,0);
        if (lVar6 == 0) goto LAB_00119bfe;
        bVar5 = Token::operator==(*(Token **)(lVar6 + 0x38),TOK_ID);
        if (bVar5) {
          lVar6 = plVar1[9];
          plVar1[9] = 0;
          if (lVar6 == 0) {
            pp_Var7 = (_func_int **)0x0;
          }
          else {
            pp_Var7 = (_func_int **)__dynamic_cast(lVar6,&Expr::typeinfo,&TokenExpr::typeinfo,0);
          }
          lVar6 = plVar1[10];
          plVar1[10] = 0;
          pLVar8 = (Lexer *)operator_new(0x10);
          pLVar8->_vptr_Lexer = pp_Var7;
          *(long *)&pLVar8->cfg = lVar6;
          goto LAB_00119bb0;
        }
      }
      local_38 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
      sVar3 = plVar1[4];
      sVar4 = plVar1[5];
      sVar2 = plVar1[6];
      local_38->logLevel = LVL_ERROR;
      local_38->err = STX_ERR_INVALID_VARDECL_ID;
      (local_38->pos).line = sVar3;
      (local_38->pos).startIndex = sVar4;
      (local_38->pos).endIndex = sVar2;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (Parser *)local_30;
    }
    else {
LAB_00119afd:
      local_38 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
      sVar3 = plVar1[4];
      sVar4 = plVar1[5];
      sVar2 = plVar1[6];
      local_38->logLevel = LVL_ERROR;
      local_38->err = STX_ERR_EXPECTED_VARDECL;
      (local_38->pos).line = sVar3;
      (local_38->pos).startIndex = sVar4;
      (local_38->pos).endIndex = sVar2;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (Parser *)(local_30 + 8);
    }
    generateError(this_00,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)rhs);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)this_00);
    if (local_38 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_38,local_38);
    }
  }
  this->lexer = (Lexer *)0x0;
  pLVar8 = (Lexer *)0x0;
LAB_00119bb0:
  this->lexer = pLVar8;
  return (__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
          )(__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TemplateDecl> Parser::fromExprToTemplateDecl(std::unique_ptr<Expr> &&rhs) noexcept {
  if (!rhs) {
    return nullptr;
  }

  if (isTokenExpr(*rhs, TokenType::TOK_ID)) {
    return std::make_unique<TemplateDecl>(std::unique_ptr<TokenExpr>(
          dynamic_cast<TokenExpr*>(rhs.release())));
  }

  if (!isBiOpExpr(*rhs, TokenType::TOK_OP_DCL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, rhs->getPosition()));
    return nullptr;
  }

  BiOpExpr& bioprhs = dynamic_cast<BiOpExpr&>(*rhs);

  if (!isTokenExpr(bioprhs.getLeft(), TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR, SyntaxErrorCode::STX_ERR_INVALID_VARDECL_ID, bioprhs.getPosition()));
    return nullptr;
  }
  
  return std::make_unique<TemplateDecl>(
    std::unique_ptr<TokenExpr>(dynamic_cast<TokenExpr*>(bioprhs.getLeftPtr().release())),
    bioprhs.getRightPtr());
}